

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O1

void __thiscall OutputFile::~OutputFile(OutputFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OutputFile *pOVar2;
  OutputFile *pOVar3;
  pointer pcVar4;
  
  for (pOVar2 = (OutputFile *)
                (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; pOVar2 != this;
      pOVar2 = (OutputFile *)
               (pOVar2->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    pOVar3 = (OutputFile *)
             (pOVar2->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
             _M_impl._M_node._M_size;
    if (pOVar3 != (OutputFile *)0x0) {
      ~OutputFile(pOVar3);
      operator_delete(pOVar3,0xd8);
    }
  }
  pcVar4 = (this->keySeparator)._M_dataplus._M_p;
  paVar1 = &(this->keySeparator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->eol)._M_dataplus._M_p;
  paVar1 = &(this->eol).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->value)._M_dataplus._M_p;
  paVar1 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->key)._M_dataplus._M_p;
  paVar1 = &(this->key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->version)._M_dataplus._M_p;
  paVar1 = &(this->version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pOVar2 = (OutputFile *)
           (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (pOVar2 != this) {
    pOVar3 = (OutputFile *)
             (pOVar2->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    operator_delete(pOVar2,0x18);
    pOVar2 = pOVar3;
  }
  return;
}

Assistant:

OutputFile::~OutputFile() {
  for (list<OutputFile*>::iterator it = descendants.begin(); it != descendants.end(); ++it) {
    delete *it;
  }
}